

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

string * moveToAlgebraic_abi_cxx11_(string *__return_storage_ptr__,move change)

{
  string extra;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_90);
  if ((uint3)((int3)change - 0x20000U) < 0x80000) {
    std::__cxx11::string::assign((char *)&local_70);
  }
  squareToAlgebraic_abi_cxx11_(&local_30,change.start);
  squareToAlgebraic_abi_cxx11_(&local_50,change.end);
  std::operator+(&local_90,&local_30,&local_50);
  std::operator+(__return_storage_ptr__,&local_90,&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string moveToAlgebraic(const move change) {
  std::string extra = "";
  if(change.special >= 2 && change.special <= 9) {
    switch((change.special - 1) % 4) {
      case 1:
        extra = "q";
        break;
      case 2:
        extra = "r";
        break;
      case 3:
        extra = "n";
        break;
      default:
        extra = "b";
        break;
    }
  }
  return squareToAlgebraic(change.start) + squareToAlgebraic(change.end) + extra;
}